

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
VectorInstance::op_replaceFirst_fromIndex_with
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined8 *puVar4;
  shared_ptr<Instance> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  int i;
  int from_index;
  shared_ptr<Instance> temporary;
  shared_ptr<Instance> instance;
  shared_ptr<Instance> *in_stack_fffffffffffffef8;
  allocator *paVar5;
  shared_ptr<Instance> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int iVar6;
  int iVar7;
  allocator local_c1 [9];
  string *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar8;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar3 != 3) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,0);
  get_shared_instance(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,2);
  get_shared_instance(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,1);
  IntegerInstance::IntegerInstance
            ((IntegerInstance *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  iVar2 = IntegerInstance::value((IntegerInstance *)&stack0xffffffffffffff58);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1c1bf9);
  if ((iVar2 < 0) ||
     (iVar6 = iVar2, iVar7 = iVar2,
     sVar3 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
             size((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                  (in_RSI + 0x78)), (int)sVar3 < iVar6)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  do {
    iVar8 = iVar2;
    sVar3 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
            size((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 (in_RSI + 0x78));
    if ((int)sVar3 <= iVar2) {
LAB_001c1d6a:
      paVar5 = local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"null",paVar5);
      std::allocator<char>::~allocator((allocator<char> *)local_c1);
      std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c1da6);
      std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c1db3);
      return in_RDI;
    }
    std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::operator[]
              ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
               (in_RSI + 0x78),(long)iVar8);
    bVar1 = InstanceIsEqualToComparator::operator()
                      ((InstanceIsEqualToComparator *)CONCAT44(iVar7,iVar6),
                       (shared_ptr<Instance> *)CONCAT44(iVar2,in_stack_ffffffffffffff08),
                       in_stack_ffffffffffffff00);
    in_stack_ffffffffffffff08 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff08);
    if (bVar1) {
      this_00 = (shared_ptr<Instance> *)(in_RSI + 0x58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDX,2);
      get_shared_instance(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
      operator[]((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 (in_RSI + 0x78),(long)iVar8);
      std::shared_ptr<Instance>::operator=(this_00,in_stack_fffffffffffffef8);
      std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c1d56);
      goto LAB_001c1d6a;
    }
    iVar2 = iVar8 + 1;
  } while( true );
}

Assistant:

std::string VectorInstance::op_replaceFirst_fromIndex_with(const std::vector<std::string>& arguments) {
    if (arguments.size() != 3)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    std::shared_ptr<Instance> temporary = get_shared_instance(_element_type, arguments[2]);
    int from_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    for (int i = from_index; i < int(_value.size()); i++)
        if (InstanceIsEqualToComparator()(_value[i], instance)) {
            _value[i] = get_shared_instance(_element_type, arguments[2]);
            break;
        }
    return "null";
}